

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*>::reallocateTo
          (SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*> *this,size_type newCapacity)

{
  StructUnionMemberSyntax **__last;
  EVP_PKEY_CTX *ctx;
  StructUnionMemberSyntax **in_RSI;
  SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*> *in_RDI;
  pointer newData;
  
  __last = (StructUnionMemberSyntax **)operator_new(0x7a83e6);
  begin(in_RDI);
  ctx = (EVP_PKEY_CTX *)end(in_RDI);
  std::
  uninitialized_move<slang::syntax::StructUnionMemberSyntax**,slang::syntax::StructUnionMemberSyntax**>
            (in_RSI,__last,(StructUnionMemberSyntax **)in_RDI);
  cleanup(in_RDI,ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }